

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

ExprP<tcu::Vector<float,_2>_> __thiscall
vkt::shaderexecutor::ContainerExprPBase<tcu::Matrix<float,_2,_2>_>::operator[]
          (ContainerExprPBase<tcu::Matrix<float,_2,_2>_> *this,int i)

{
  deInt32 *pdVar1;
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  SharedPtrStateBase *extraout_RDX_00;
  undefined4 in_register_00000034;
  ExprP<tcu::Vector<float,_2>_> EVar3;
  ExprP<tcu::Matrix<float,_2,_2>_> ret;
  ExprP<tcu::Matrix<float,_2,_2>_> local_18;
  SharedPtrStateBase *pSVar2;
  
  local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
       (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
  local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state =
       (SharedPtrStateBase *)0x0;
  pSVar2 = (SharedPtrStateBase *)((undefined8 *)CONCAT44(in_register_00000034,i))[1];
  if (pSVar2 != (SharedPtrStateBase *)0x0) {
    local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
    super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
         *(Expr<tcu::Matrix<float,_2,_2>_> **)CONCAT44(in_register_00000034,i);
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pSVar2->weakRefCount = pSVar2->weakRefCount + 1;
    UNLOCK();
    local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
    super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state = pSVar2;
  }
  EVar3 = Functions::getComponent<tcu::Matrix<float,2,2>>((Functions *)this,&local_18,in_EDX);
  pSVar2 = EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
           super_ExprPBase<tcu::Vector<float,_2>_>.
           super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state;
  if (local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
      (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_ptr =
           (Expr<tcu::Matrix<float,_2,_2>_> *)0x0;
      (*(local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[2])();
      pSVar2 = extraout_RDX;
    }
    LOCK();
    pdVar1 = &(local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
               super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)
              ->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) &&
       (local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
        super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
        super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state !=
        (SharedPtrStateBase *)0x0)) {
      (*(local_18.super_ContainerExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_ExprPBase<tcu::Matrix<float,_2,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Matrix<float,_2,_2>_>_>.m_state)->
        _vptr_SharedPtrStateBase[1])();
      pSVar2 = extraout_RDX_00;
    }
  }
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_state = pSVar2;
  EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.super_ExprPBase<tcu::Vector<float,_2>_>.
  super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>.m_ptr =
       (Expr<tcu::Vector<float,_2>_> *)this;
  return (ExprP<tcu::Vector<float,_2>_>)
         EVar3.super_ContainerExprPBase<tcu::Vector<float,_2>_>.
         super_ExprPBase<tcu::Vector<float,_2>_>.
         super_SharedPtr<const_vkt::shaderexecutor::Expr<tcu::Vector<float,_2>_>_>;
}

Assistant:

ExprP<typename T::Element> ContainerExprPBase<T>::operator[] (int i) const
{
	return Functions::getComponent(exprP<T>(*this), i);
}